

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O1

void __thiscall QFontDialogPrivate::updateSample(QFontDialogPrivate *this)

{
  QAbstractItemView *pQVar1;
  int iVar2;
  long lVar3;
  QArrayData *pQVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QArrayDataPointer<QString> local_70;
  QModelIndex local_58;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text((QString *)&local_58,this->sizeEdit);
  QVar5.m_data = (storage_type_conflict *)local_58.i;
  QVar5.m_size = (qsizetype)local_58.m.ptr;
  QString::toIntegral_helper(QVar5,(bool *)0x0,10);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex(&local_58,pQVar1);
  iVar2 = local_58.r;
  lVar3 = (long)local_58.r;
  if (lVar3 < 0) {
    local_58._0_8_ = (QArrayData *)0x0;
    local_58.i = 0;
    local_58.m.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    local_58._0_8_ = local_70.ptr[lVar3].d.d;
    local_58.i = (quintptr)local_70.ptr[lVar3].d.ptr;
    local_58.m.ptr = (QAbstractItemModel *)local_70.ptr[lVar3].d.size;
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_58._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_58._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (-1 < iVar2) {
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  }
  QFontDatabase::font((QString *)&local_38,(QString *)&local_58,(int)this + 0x3b0);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  QAbstractButton::isChecked(&this->strikeout->super_QAbstractButton);
  QFont::setStrikeOut(SUB81(&local_38,0));
  QAbstractButton::isChecked(&this->underline->super_QAbstractButton);
  QFont::setUnderline(SUB81(&local_38,0));
  pQVar1 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex(&local_58,pQVar1);
  iVar2 = local_58.r;
  lVar3 = (long)local_58.r;
  if (lVar3 < 0) {
    pQVar4 = (QArrayData *)0x0;
    lVar3 = 0;
  }
  else {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    pQVar4 = *(QArrayData **)(local_58.i + lVar3 * 0x18);
    lVar3 = *(long *)(local_58.i + lVar3 * 0x18 + 0x10);
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (-1 < iVar2) {
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (lVar3 == 0) {
    QLineEdit::clear(this->sampleEdit);
  }
  updateSampleFont(this,(QFont *)&local_38);
  QFont::~QFont((QFont *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::updateSample()
{
    // compute new font
    int pSize = sizeEdit->text().toInt();
    QFont newFont(QFontDatabase::font(familyList->currentText(), style, pSize));
    newFont.setStrikeOut(strikeout->isChecked());
    newFont.setUnderline(underline->isChecked());

    if (familyList->currentText().isEmpty())
        sampleEdit->clear();

    updateSampleFont(newFont);
}